

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<std::pair<phmap::priv::NonStandardLayout,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout,int>>>,void>
               (vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
                *container,ostream *os)

{
  pointer ppVar1;
  long lVar2;
  pointer value;
  
  std::operator<<(os,'{');
  value = (container->
          super__Vector_base<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (container->
           super__Vector_base<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = 0;
  do {
    if (value == ppVar1) {
      if (lVar2 != 0) {
LAB_00172e36:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_00172e36;
    }
    std::operator<<(os,' ');
    PrintTo<phmap::priv::NonStandardLayout,int>(value,os);
    lVar2 = lVar2 + 1;
    value = value + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }